

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

HeapThunk * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,jsonnet::internal::(anonymous_namespace)::HeapObject*&,unsigned_int&,jsonnet::internal::AST*const&>
          (Interpreter *this,Identifier **args,HeapObject **args_1,uint *args_2,AST **args_3)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  Interpreter IVar3;
  HeapThunk *from;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  HeapThunk *local_38;
  
  from = (HeapThunk *)operator_new(0x70);
  *(undefined2 *)&(from->super_HeapEntity).type = 0;
  (from->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0029b638;
  from->name = (Identifier *)args;
  p_Var1 = &(from->upValues)._M_t._M_impl.super__Rb_tree_header;
  (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  from->self = (HeapObject *)args_1;
  from->offset = (uint)args_2;
  from->body = (AST *)args_3;
  local_38 = from;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)(this + 0x18),(value_type *)&local_38);
  IVar3 = this[0x10];
  (from->super_HeapEntity).mark = (GarbageCollectionMark)IVar3;
  uVar5 = *(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3;
  *(ulong *)(this + 0x38) = uVar5;
  if ((*(uint *)this < uVar5) &&
     (auVar6._8_4_ = (int)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 0x23),
     auVar6._0_8_ = uVar5, auVar6._12_4_ = 0x45300000, uVar2 = *(undefined8 *)(this + 0x30),
     auVar7._8_4_ = (int)((ulong)uVar2 >> 0x20), auVar7._0_8_ = uVar2, auVar7._12_4_ = 0x45300000,
     ((auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * *(double *)(this + 8) <
     (auVar6._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0))) {
    anon_unknown_0::Heap::markFrom((Heap *)(ulong)(byte)IVar3,(HeapEntity *)from);
    anon_unknown_0::Stack::mark(*(Stack **)(this + 0x60),*(Heap **)(this + 0x68));
    if (((byte)this[0x40] & 0x10) != 0) {
      anon_unknown_0::Heap::markFrom
                ((Heap *)(ulong)*(uint *)(this + 0x10),*(HeapEntity **)(this + 0x48));
    }
    for (p_Var4 = *(_Rb_tree_node_base **)(this + 0xe0);
        p_Var4 != (_Rb_tree_node_base *)(this + 0xd0);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if (*(HeapEntity **)(*(long *)(p_Var4 + 3) + 0x40) != (HeapEntity *)0x0) {
        anon_unknown_0::Heap::markFrom
                  ((Heap *)(ulong)*(uint *)(this + 0x10),
                   *(HeapEntity **)(*(long *)(p_Var4 + 3) + 0x40));
      }
    }
    for (p_Var4 = *(_Rb_tree_node_base **)(this + 0x1b0);
        p_Var4 != (_Rb_tree_node_base *)(this + 0x1a0);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      anon_unknown_0::Heap::markFrom
                ((Heap *)(ulong)*(uint *)(this + 0x10),*(HeapEntity **)(p_Var4 + 2));
    }
    anon_unknown_0::Heap::sweep((Heap *)this);
  }
  return from;
}

Assistant:

T *makeHeap(Args &&... args)
    {
        T *r = heap.makeEntity<T, Args...>(std::forward<Args>(args)...);
        if (heap.checkHeap()) {  // Do a GC cycle?
            // Avoid the object we just made being collected.
            heap.markFrom(r);

            // Mark from the stack.
            stack.mark(heap);

            // Mark from the scratch register
            heap.markFrom(scratch);

            // Mark from cached imports
            for (const auto &pair : cachedImports) {
                HeapThunk *thunk = pair.second->thunk;
                if (thunk != nullptr)
                    heap.markFrom(thunk);
            }

            for (const auto &sourceVal : sourceVals) {
                heap.markFrom(sourceVal.second);
            }

            // Delete unreachable objects.
            heap.sweep();
        }
        return r;
    }